

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ActivationPReLU::SerializeWithCachedSizes
          (ActivationPReLU *this,CodedOutputStream *output)

{
  if (this->alpha_ != (WeightParams *)0x0 &&
      this != (ActivationPReLU *)&_ActivationPReLU_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->alpha_->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void ActivationPReLU::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ActivationPReLU)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.WeightParams alpha = 1;
  if (this->has_alpha()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->alpha_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ActivationPReLU)
}